

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_get_length(wally_tx *tx,tx_serialize_opts *opts,uint32_t flags,size_t *written,
                 _Bool is_elements)

{
  int iVar1;
  size_t local_50;
  size_t witness_count;
  size_t witness_size;
  size_t base_size;
  size_t *psStack_30;
  _Bool is_elements_local;
  size_t *written_local;
  tx_serialize_opts *ptStack_20;
  uint32_t flags_local;
  tx_serialize_opts *opts_local;
  wally_tx *tx_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
    base_size._7_1_ = is_elements;
    psStack_30 = written;
    written_local._4_4_ = flags;
    ptStack_20 = opts;
    opts_local = (tx_serialize_opts *)tx;
    iVar1 = tx_get_lengths(tx,opts,flags,&witness_size,&witness_count,&local_50,is_elements);
    if (iVar1 == 0) {
      if ((local_50 == 0) || ((written_local._4_4_ & 1) == 0)) {
        *psStack_30 = witness_size;
      }
      else {
        *psStack_30 = witness_size + witness_count;
      }
      return 0;
    }
  }
  return -2;
}

Assistant:

static int tx_get_length(const struct wally_tx *tx,
                         const struct tx_serialize_opts *opts, uint32_t flags,
                         size_t *written, bool is_elements)
{
    size_t base_size, witness_size, witness_count;

    if (written)
        *written = 0;

    if (!written ||
        tx_get_lengths(tx, opts, flags, &base_size, &witness_size,
                       &witness_count, is_elements) != WALLY_OK)
        return WALLY_EINVAL;

    if (witness_count && (flags & WALLY_TX_FLAG_USE_WITNESS))
        *written = base_size + witness_size;
    else
        *written = base_size;

    return WALLY_OK;
}